

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O2

bool __thiscall OSToken::resetToken(OSToken *this,ByteString *label)

{
  long lVar1;
  Directory *pDVar2;
  int iVar3;
  int iVar4;
  ObjectFile *this_00;
  OSAttribute *pOVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  char *pcVar8;
  int lineNo;
  _Self __tmp;
  uint local_208;
  undefined4 uStack_204;
  ByteString *local_200;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *local_1f8;
  MutexLocker lock;
  set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> cleanUp;
  string local_1b0 [32];
  string local_190 [32];
  OSAttribute tokenFlags;
  OSAttribute tokenLabel;
  
  iVar3 = (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[4])(this,&local_208);
  if ((char)iVar3 == '\0') {
    softHSMLog(3,"resetToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,499,"Failed to get the token attributes");
    return false;
  }
  local_200 = label;
  (*(this->super_ObjectStoreToken)._vptr_ObjectStoreToken[8])(&cleanUp,this);
  MutexLocker::MutexLocker(&lock,this->tokenMutex);
  local_1f8 = &this->objects;
  for (p_Var6 = cleanUp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != &cleanUp._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    lVar1 = *(long *)(p_Var6 + 1);
    if ((lVar1 == 0) ||
       (this_00 = (ObjectFile *)__dynamic_cast(lVar1,&OSObject::typeinfo,&ObjectFile::typeinfo,0),
       this_00 == (ObjectFile *)0x0)) {
      bVar7 = false;
      softHSMLog(3,"resetToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x202,"Object type not compatible with this token class 0x%08X",lVar1);
      goto LAB_00166b5d;
    }
    ObjectFile::invalidate(this_00);
    ObjectFile::getFilename_abi_cxx11_((string *)&tokenLabel,this_00);
    pDVar2 = this->tokenDir;
    std::__cxx11::string::string(local_190,(string *)&tokenLabel);
    iVar3 = Directory::remove(pDVar2,(char *)local_190);
    std::__cxx11::string::~string(local_190);
    if ((char)iVar3 == '\0') {
      softHSMLog(3,"resetToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x210,"Failed to delete object file %s",tokenLabel._vptr_OSAttribute);
      std::__cxx11::string::~string((string *)&tokenLabel);
LAB_00166b14:
      bVar7 = false;
      goto LAB_00166b5d;
    }
    ObjectFile::getLockname_abi_cxx11_((string *)&tokenFlags,this_00);
    pDVar2 = this->tokenDir;
    std::__cxx11::string::string(local_1b0,(string *)&tokenFlags);
    iVar4 = Directory::remove(pDVar2,(char *)local_1b0);
    std::__cxx11::string::~string(local_1b0);
    lineNo = 0x21b;
    iVar3 = 3;
    pcVar8 = "Failed to delete lock file %s";
    pOVar5 = &tokenFlags;
    if ((char)iVar4 != '\0') {
      lineNo = 0x222;
      std::
      _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
      ::erase(&local_1f8->_M_t,(key_type *)(p_Var6 + 1));
      iVar3 = 7;
      pcVar8 = "Deleted object %s";
      pOVar5 = &tokenLabel;
    }
    softHSMLog(iVar3,"resetToken",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
               ,lineNo,pcVar8,((_Alloc_hider *)&pOVar5->_vptr_OSAttribute)->_M_p);
    std::__cxx11::string::~string((string *)&tokenFlags);
    std::__cxx11::string::~string((string *)&tokenLabel);
    if ((char)iVar4 == '\0') goto LAB_00166b14;
  }
  local_208 = local_208 & 0xfff0fff7;
  OSAttribute::OSAttribute(&tokenLabel,local_200);
  OSAttribute::OSAttribute(&tokenFlags,CONCAT44(uStack_204,local_208));
  iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[8])
                    (this->tokenObject,0x80005349,&tokenLabel);
  pcVar8 = "Failed to set the token attributes";
  iVar4 = 0x233;
  if (((char)iVar3 != '\0') &&
     (iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[8])
                        (this->tokenObject,0x8000534b,&tokenFlags), (char)iVar3 != '\0')) {
    iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[2])(this->tokenObject,0x8000534d);
    if (((char)iVar3 == '\0') ||
       (iVar3 = (*(this->tokenObject->super_OSObject)._vptr_OSObject[9])
                          (this->tokenObject,0x8000534d), (char)iVar3 != '\0')) {
      softHSMLog(7,"resetToken",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x240,"Token instance %s was succesfully reset",(this->tokenPath)._M_dataplus._M_p
                );
      Generation::update(this->gen);
      bVar7 = true;
      Generation::commit(this->gen);
      goto LAB_00166b43;
    }
    pcVar8 = "Failed to remove USERPIN";
    iVar4 = 0x23b;
  }
  bVar7 = false;
  softHSMLog(3,"resetToken",
             "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
             ,iVar4,pcVar8);
LAB_00166b43:
  OSAttribute::~OSAttribute(&tokenFlags);
  OSAttribute::~OSAttribute(&tokenLabel);
LAB_00166b5d:
  MutexLocker::~MutexLocker(&lock);
  std::
  _Rb_tree<OSObject_*,_OSObject_*,_std::_Identity<OSObject_*>,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>
  ::~_Rb_tree(&cleanUp._M_t);
  return bVar7;
}

Assistant:

bool OSToken::resetToken(const ByteString& label)
{
	CK_ULONG flags;

	if (!getTokenFlags(flags))
	{
		ERROR_MSG("Failed to get the token attributes");

		return false;
	}

	// Clean up
	std::set<OSObject*> cleanUp = getObjects();

	MutexLocker lock(tokenMutex);

	for (std::set<OSObject*>::iterator i = cleanUp.begin(); i != cleanUp.end(); i++)
	{
		ObjectFile* fileObject = dynamic_cast<ObjectFile*>(*i);
		if (fileObject == NULL)
		{
			ERROR_MSG("Object type not compatible with this token class 0x%08X", *i);

			return false;
		}

		// Invalidate the object instance
		fileObject->invalidate();

		// Retrieve the filename of the object
		std::string objectFilename = fileObject->getFilename();

		// Attempt to delete the file
		if (!tokenDir->remove(objectFilename))
		{
			ERROR_MSG("Failed to delete object file %s", objectFilename.c_str());

			return false;
		}

		// Retrieve the filename of the lock
		std::string lockFilename = fileObject->getLockname();

		// Attempt to delete the lock
		if (!tokenDir->remove(lockFilename))
		{
			ERROR_MSG("Failed to delete lock file %s", lockFilename.c_str());

			return false;
		}

		objects.erase(*i);

		DEBUG_MSG("Deleted object %s", objectFilename.c_str());
	}

	// The user PIN has been removed
	flags &= ~CKF_USER_PIN_INITIALIZED;
	flags &= ~CKF_USER_PIN_COUNT_LOW;
	flags &= ~CKF_USER_PIN_FINAL_TRY;
	flags &= ~CKF_USER_PIN_LOCKED;
	flags &= ~CKF_USER_PIN_TO_BE_CHANGED;

	// Set new token attributes
	OSAttribute tokenLabel(label);
	OSAttribute tokenFlags(flags);

	if (!tokenObject->setAttribute(CKA_OS_TOKENLABEL, tokenLabel) ||
	    !tokenObject->setAttribute(CKA_OS_TOKENFLAGS, tokenFlags))
	{
		ERROR_MSG("Failed to set the token attributes");

		return false;
	}

	if (tokenObject->attributeExists(CKA_OS_USERPIN) &&
	    !tokenObject->deleteAttribute(CKA_OS_USERPIN))
	{
		ERROR_MSG("Failed to remove USERPIN");

		return false;
	}

	DEBUG_MSG("Token instance %s was succesfully reset", tokenPath.c_str());

	gen->update();
	gen->commit();

	return true;
}